

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.cpp
# Opt level: O0

unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> __thiscall
acto::core::object_t::select_message(object_t *this)

{
  msg_t *__p;
  long in_RSI;
  mpsc_stack<acto::core::msg_t> local_28;
  msg_t *local_20;
  msg_t *p;
  object_t *this_local;
  
  this_local = this;
  local_20 = intrusive::stack<acto::core::msg_t>::pop((stack<acto::core::msg_t> *)(in_RSI + 0x48));
  if (local_20 == (msg_t *)0x0) {
    intrusive::mpsc_stack<acto::core::msg_t>::extract(&local_28);
    intrusive::stack<acto::core::msg_t>::push
              ((stack<acto::core::msg_t> *)(in_RSI + 0x48),(sequence<acto::core::msg_t> *)&local_28)
    ;
    __p = intrusive::stack<acto::core::msg_t>::pop((stack<acto::core::msg_t> *)(in_RSI + 0x48));
    std::unique_ptr<acto::core::msg_t,std::default_delete<acto::core::msg_t>>::
    unique_ptr<std::default_delete<acto::core::msg_t>,void>
              ((unique_ptr<acto::core::msg_t,std::default_delete<acto::core::msg_t>> *)this,__p);
  }
  else {
    std::unique_ptr<acto::core::msg_t,std::default_delete<acto::core::msg_t>>::
    unique_ptr<std::default_delete<acto::core::msg_t>,void>
              ((unique_ptr<acto::core::msg_t,std::default_delete<acto::core::msg_t>> *)this,local_20
              );
  }
  return (__uniq_ptr_data<acto::core::msg_t,_std::default_delete<acto::core::msg_t>,_true,_true>)
         (__uniq_ptr_data<acto::core::msg_t,_std::default_delete<acto::core::msg_t>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<msg_t> object_t::select_message() noexcept {
  if (msg_t* p = local_stack.pop()) {
    return std::unique_ptr<msg_t>(p);
  } else {
    local_stack.push(input_stack.extract());
    return std::unique_ptr<msg_t>(local_stack.pop());
  }
}